

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O2

int __thiscall Match::play(Match *this,int numGames)

{
  Match *pMVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Move local_8c;
  int local_84;
  Match *local_80;
  vector<Move,_std::allocator<Move>_> moveHistory1;
  vector<Move,_std::allocator<Move>_> moveHistory2;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Playing match between ");
  std::__cxx11::string::string((string *)&moveHistory1,(string *)&this->m_p1->m_name);
  poVar4 = std::operator<<(poVar4,(string *)&moveHistory1);
  poVar4 = std::operator<<(poVar4," and ");
  std::__cxx11::string::string((string *)&moveHistory2,(string *)&this->m_p2->m_name);
  poVar4 = std::operator<<(poVar4,(string *)&moveHistory2);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&moveHistory2);
  std::__cxx11::string::~string((string *)&moveHistory1);
  moveHistory1.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  moveHistory1.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  moveHistory1.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  moveHistory2.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = 0;
  if (numGames < 1) {
    numGames = iVar6;
  }
  moveHistory2.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  moveHistory2.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80 = this;
  while( true ) {
    pMVar1 = local_80;
    if (numGames == 0) break;
    local_84 = numGames + -1;
    iVar2 = (*local_80->m_p1->_vptr_Player[2])(local_80->m_p1,&moveHistory1);
    iVar3 = (*pMVar1->m_p2->_vptr_Player[2])(pMVar1->m_p2,(string *)&moveHistory2);
    uVar5 = ((iVar2 - iVar3) + 3U) % 3;
    uVar7 = (uint)(uVar5 == 1);
    if (uVar5 == 2) {
      uVar7 = 0xffffffff;
    }
    local_8c.m_me = iVar2;
    local_8c.m_you = iVar3;
    std::vector<Move,_std::allocator<Move>_>::emplace_back<Move>(&moveHistory1,&local_8c);
    local_8c.m_me = iVar3;
    local_8c.m_you = iVar2;
    std::vector<Move,_std::allocator<Move>_>::emplace_back<Move>(&moveHistory2,&local_8c);
    iVar6 = iVar6 + uVar7;
    numGames = local_84;
  }
  std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
            (&moveHistory2.super__Vector_base<Move,_std::allocator<Move>_>);
  std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
            (&moveHistory1.super__Vector_base<Move,_std::allocator<Move>_>);
  return iVar6;
}

Assistant:

int Match::play(int numGames)
{
   std::cout << "Playing match between " << m_p1->name() << " and "
      << m_p2->name() << std::endl;

   // The two variables below contain the same information, but in two different orders.
   std::vector<Move> moveHistory1;  // History of moves so far, seen from p1's perspective.
   std::vector<Move> moveHistory2;  // History of moves so far, seen from p2's perspective.

   int sum = 0;
   for (int g=0; g<numGames; ++g)
   {
      unsigned int draw1 = m_p1->move(moveHistory1);
      unsigned int draw2 = m_p2->move(moveHistory2);

      assert (draw1 < 3);
      assert (draw2 < 3);

      int res = 0;
      switch ((draw1-draw2+3) % 3)
      {
         case 0 : break;    // draw
         case 1 : res = 1;  // P1 wins
                  break;
         case 2 : res = -1; // P1 loses
                  break;
      }

#ifdef DEBUG
      std::cout << "Game " << g << ": " << names[draw1] << " v " << names[draw2] << " : " << res << std::endl; 
#endif

      moveHistory1.push_back(Move(draw1, draw2));
      moveHistory2.push_back(Move(draw2, draw1));

      sum += res;
   } // end of for

   return sum;
}